

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O1

int luaopen_clientsocket(lua_State *L)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  undefined8 *puVar2;
  luaL_Reg *plVar3;
  byte bVar4;
  pthread_t pid;
  luaL_Reg l [6];
  pthread_t local_80;
  luaL_Reg local_78 [6];
  
  bVar4 = 0;
  luaL_checkversion_(L,503.0,0x88);
  puVar2 = &DAT_00162b50;
  plVar3 = local_78;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    plVar3->name = (char *)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    plVar3 = (luaL_Reg *)&plVar3[-(ulong)bVar4].func;
  }
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,5);
  luaL_setfuncs(L,local_78,0);
  __mutex = (pthread_mutex_t *)lua_newuserdata(L,0x2030);
  memset(__mutex,0,0x2030);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  lua_pushcclosure(L,lreadstdin,1);
  lua_setfield(L,-2,"readstdin");
  pthread_create(&local_80,(pthread_attr_t *)0x0,readline_stdin,__mutex);
  return 1;
}

Assistant:

int
luaopen_clientsocket(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] = {
		{ "connect", lconnect },
		{ "recv", lrecv },
		{ "send", lsend },
		{ "close", lclose },
		{ "usleep", lusleep },
		{ NULL, NULL },
	};
	luaL_newlib(L, l);

	struct queue * q = lua_newuserdata(L, sizeof(*q));
	memset(q, 0, sizeof(*q));
	pthread_mutex_init(&q->lock, NULL);
	lua_pushcclosure(L, lreadstdin, 1);
	lua_setfield(L, -2, "readstdin");

	pthread_t pid ;
	pthread_create(&pid, NULL, readline_stdin, q);

	return 1;
}